

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void * Node_GetData(node *p,dataid Id,datatype Type)

{
  nodedata *local_38;
  nodedata *i;
  uint_fast32_t Code;
  datatype Type_local;
  dataid Id_local;
  node *p_local;
  
  local_38 = p->Data;
  while( true ) {
    if (local_38 == (nodedata *)0x0) {
      return (void *)0x0;
    }
    if (local_38->Code == (Id << 8 | Type)) break;
    local_38 = local_38->Next;
  }
  return local_38 + 1;
}

Assistant:

void* Node_GetData(const node* p, dataid Id, datatype Type)
{
    uint_fast32_t Code = (Id<<DYNDATA_SHIFT)|Type;
    nodedata* i;
    for (i=p->Data;i;i=i->Next)
        if (i->Code == Code)
            return NodeData_Data(i);
    return NULL;
}